

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,decimal_fp<float> *fp,
          basic_format_specs<char16_t> *specs,float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  char cVar2;
  byte bVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar4;
  byte *pbVar5;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  bool bVar14;
  char16_t decimal_point;
  bool pointy;
  char16_t zero;
  int significand_size;
  sign_t sign;
  significand_type significand;
  int exp;
  int num_zeros;
  anon_class_28_8_41f37f66 write;
  undefined1 local_ce [2];
  uint local_cc;
  char16_t local_c6;
  int local_c4;
  undefined1 local_c0 [20];
  undefined1 local_ac [12];
  long local_a0;
  long local_98 [2];
  short local_88;
  basic_format_specs<char16_t> *local_80;
  undefined1 local_78 [8];
  undefined8 local_70;
  undefined8 local_68;
  decimal_fp<float> *local_60;
  digit_grouping<char16_t> *local_58;
  digit_grouping<char16_t> *local_50;
  char16_t *local_48;
  char16_t *local_40;
  char16_t *local_38;
  
  local_c0._16_4_ = fp->significand;
  uVar9 = 0x1f;
  if ((local_c0._16_4_ | 1) != 0) {
    for (; (local_c0._16_4_ | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar6 = (ulong)(uint)local_c0._16_4_ +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar9 * 8);
  local_c4 = (int)(uVar6 >> 0x20);
  local_c6 = L'0';
  local_c0._4_4_ = fspecs._4_4_;
  local_c0._12_4_ = (uint)local_c0._4_4_ >> 8 & 0xff;
  fVar1 = fspecs;
  if ((long)uVar6 < 0) goto LAB_001618be;
  bVar14 = local_c0._12_4_ != none;
  local_ce = (undefined1  [2])0x2e;
  uVar9 = (uint)local_c0._4_4_ >> 0x11;
  local_c0._0_8_ = fspecs;
  if ((uVar9 & 1) != 0) {
    cVar2 = fmt::v8::detail::decimal_point_impl<char>(loc);
    local_ce = (undefined1  [2])(short)cVar2;
  }
  lVar12 = (ulong)bVar14 + (uVar6 >> 0x20);
  uVar9 = fp->exponent;
  local_ac._0_4_ = local_c4 + uVar9;
  iVar10 = (int)local_c0._0_8_;
  if (SUB81(local_c0._0_8_,4) == '\x01') {
LAB_00161544:
    iVar11 = uVar9 + local_c4 + -1;
    if (((uint)local_c0._4_4_ >> 0x14 & 1) == 0) {
      uVar6 = 0;
      if (local_c4 == 1) {
        local_ce = (undefined1  [2])0x0;
      }
    }
    else {
      uVar6 = 0;
      if (0 < iVar10 - local_c4) {
        uVar6 = (ulong)(uint)(iVar10 - local_c4);
      }
      lVar12 = lVar12 + uVar6;
    }
    local_78._4_4_ = local_c0._16_4_;
    local_78._0_4_ = local_c0._12_4_;
    local_70._0_6_ = CONCAT24(local_ce,local_c4);
    local_68._0_6_ = CONCAT24(L'0',(int)uVar6);
    local_68 = (bool *)(CONCAT17(local_68._7_1_,
                                 CONCAT16((((uint)local_c0._4_4_ >> 0x10 & 1) == 0) << 5,
                                          (undefined6)local_68)) | 0x45000000000000);
    local_60 = (decimal_fp<float> *)CONCAT44(local_60._4_4_,iVar11);
    if (specs->width < 1) {
      bVar4 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char16_t,_fmt::v8::detail::digit_grouping<char16_t>_>
              ::anon_class_28_8_41f37f66::operator()
                        ((anon_class_28_8_41f37f66 *)local_78,out.container);
    }
    else {
      if ((int)local_ac._0_4_ < 1) {
        iVar11 = 1 - local_ac._0_4_;
      }
      lVar7 = 2;
      if (99 < iVar11) {
        lVar7 = (ulong)(999 < iVar11) + 3;
      }
      sVar13 = lVar12 + lVar7 + (3 - (ulong)(local_ce == (undefined1  [2])0x0));
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (out,specs,sVar13,sVar13,(anon_class_28_8_41f37f66 *)local_78);
    }
  }
  else {
    if ((local_c0._0_8_ & 0xff00000000) == 0) {
      iVar11 = 0x10;
      if (0 < iVar10) {
        iVar11 = iVar10;
      }
      if (((int)local_ac._0_4_ < -3) || (iVar11 < (int)local_ac._0_4_)) goto LAB_00161544;
    }
    if ((int)uVar9 < 0) {
      if ((int)local_ac._0_4_ < 1) {
        iVar11 = -local_ac._0_4_;
        local_ac._4_4_ = iVar11;
        if (SBORROW4(iVar10,iVar11) != iVar10 + local_ac._0_4_ < 0) {
          local_ac._4_4_ = iVar10;
        }
        if (iVar10 < 0) {
          local_ac._4_4_ = iVar11;
        }
        if (local_c4 != 0) {
          local_ac._4_4_ = iVar11;
        }
        bVar3 = 1;
        if (local_c4 == 0 && local_ac._4_4_ == 0) {
          bVar3 = (local_c0[6] & 0x10) >> 4;
        }
        local_cc = CONCAT31(local_cc._1_3_,bVar3);
        fVar1 = (float_specs)local_c0._0_8_;
        if (-1 < (int)local_ac._4_4_) {
          sVar13 = lVar12 + (ulong)((uint)bVar3 + local_ac._4_4_ + 1);
          local_78 = (undefined1  [8])(local_c0 + 0xc);
          local_70 = &local_c6;
          local_68 = (bool *)&local_cc;
          local_60 = (decimal_fp<float> *)local_ce;
          local_58 = (digit_grouping<char16_t> *)(local_ac + 4);
          local_50 = (digit_grouping<char16_t> *)(local_c0 + 0x10);
          local_48 = (char16_t *)&local_c4;
          bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_162c6e41 *)local_78);
          return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
        }
LAB_001618be:
        local_c0._0_8_ = fVar1;
        fmt::v8::detail::assert_fail
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                   ,0x195,"negative value");
      }
      iVar11 = 0;
      local_cc = iVar10 - local_c4 & (int)(local_c0._4_4_ << 0xb) >> 0x1f;
      uVar9 = local_cc;
      if ((int)local_cc < 1) {
        uVar9 = 0;
      }
      local_80 = specs;
      digit_grouping<char16_t>::digit_grouping
                ((digit_grouping<char16_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_c0._4_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(local_ac._8_4_,local_ac._4_4_);
      pbVar8 = pbVar5 + local_a0;
      sVar13 = (ulong)uVar9 + (uVar6 >> 0x20) + (ulong)bVar14;
      do {
        iVar10 = 0x7fffffff;
        if (local_88 != 0) {
          if (pbVar5 == pbVar8) {
            uVar9 = (uint)(char)pbVar8[-1];
          }
          else {
            bVar3 = *pbVar5;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00161790;
            pbVar5 = pbVar5 + 1;
            uVar9 = (uint)bVar3;
          }
          iVar11 = iVar11 + uVar9;
          iVar10 = iVar11;
        }
LAB_00161790:
        sVar13 = sVar13 + 1;
      } while (iVar10 < local_c4);
      local_78 = (undefined1  [8])(local_c0 + 0xc);
      local_70 = (char16_t *)(local_c0 + 0x10);
      local_68 = (bool *)&local_c4;
      local_60 = (decimal_fp<float> *)local_ac;
      local_58 = (digit_grouping<char16_t> *)local_ce;
      local_48 = (char16_t *)&local_cc;
      local_40 = &local_c6;
      local_50 = (digit_grouping<char16_t> *)(local_ac + 4);
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_&>
                        (out,local_80,sVar13,sVar13,(anon_class_64_8_e6ffa566 *)local_78);
    }
    else {
      lVar12 = lVar12 + (ulong)uVar9;
      local_cc = iVar10 - local_ac._0_4_;
      if (((uint)local_c0._4_4_ >> 0x14 & 1) != 0) {
        if (SUB81(local_c0._0_8_,4) != '\x02' && (int)local_cc < 1) {
          local_cc = 1;
        }
        if (0 < (int)local_cc) {
          lVar12 = lVar12 + (ulong)local_cc + 1;
        }
      }
      digit_grouping<char16_t>::digit_grouping
                ((digit_grouping<char16_t> *)(local_ac + 4),loc,
                 (bool)((byte)((uint)local_c0._4_4_ >> 0x11) & 1));
      pbVar5 = (byte *)CONCAT44(local_ac._8_4_,local_ac._4_4_);
      pbVar8 = pbVar5 + local_a0;
      sVar13 = lVar12 - 1;
      iVar10 = 0;
      do {
        iVar11 = 0x7fffffff;
        if (local_88 != 0) {
          if (pbVar5 == pbVar8) {
            uVar9 = (uint)(char)pbVar8[-1];
          }
          else {
            bVar3 = *pbVar5;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00161683;
            pbVar5 = pbVar5 + 1;
            uVar9 = (uint)bVar3;
          }
          iVar10 = iVar10 + uVar9;
          iVar11 = iVar10;
        }
LAB_00161683:
        sVar13 = sVar13 + 1;
      } while (iVar11 < local_c4);
      local_78 = (undefined1  [8])(local_c0 + 0xc);
      local_70 = (char16_t *)(local_c0 + 0x10);
      local_68 = (bool *)&local_c4;
      local_50 = (digit_grouping<char16_t> *)local_c0;
      local_48 = (char16_t *)local_ce;
      local_40 = (char16_t *)&local_cc;
      local_38 = &local_c6;
      local_60 = fp;
      local_58 = (digit_grouping<char16_t> *)(local_ac + 4);
      bVar4 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_&>
                        (out,specs,sVar13,sVar13,(anon_class_72_9_d68ba176 *)local_78);
    }
    if ((long *)CONCAT44(local_ac._8_4_,local_ac._4_4_) != local_98) {
      operator_delete((long *)CONCAT44(local_ac._8_4_,local_ac._4_4_),local_98[0] + 1);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}